

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O2

int __thiscall Fl_Table::handle(Fl_Table *this,int event)

{
  ResizeFlag RVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  TableContext TVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Cursor FVar9;
  int R;
  int C;
  ResizeFlag resizeflag;
  int local_38;
  int local_34;
  
  iVar4 = Fl_Group::handle(&this->super_Fl_Group,event);
  TVar5 = cursor2rowcol(this,&R,&C,&resizeflag);
  iVar8 = 1;
  if (iVar4 != 0) {
    iVar6 = Fl::event_inside((Fl_Widget *)this->hscrollbar);
    if (iVar6 != 0) {
      return 1;
    }
    iVar6 = Fl::event_inside((Fl_Widget *)this->vscrollbar);
    if (iVar6 != 0) {
      return 1;
    }
    if ((((TVar5 != CONTEXT_ROW_HEADER) && (TVar5 != CONTEXT_COL_HEADER)) &&
        ((Fl_Table *)Fl::focus_ != this)) &&
       (iVar6 = Fl_Widget::contains((Fl_Widget *)this,Fl::focus_), iVar6 != 0)) {
      return 1;
    }
  }
  iVar3 = Fl::e_keysym;
  iVar7 = Fl::e_y;
  iVar6 = Fl::e_x;
  switch(event) {
  case 1:
    local_38 = Fl::e_y;
    local_34 = Fl::e_x;
    RVar1 = resizeflag;
    if (Fl::e_keysym == 0xfee9 && Fl::e_clicks == 0) {
      if ((Fl_Table *)Fl::focus_ == this) {
        Fl_Widget::take_focus((Fl_Widget *)this);
        this->_callback_context = CONTEXT_TABLE;
        this->_callback_row = -1;
        this->_callback_col = -1;
        Fl_Widget::do_callback((Fl_Widget *)this);
        iVar4 = 1;
      }
      iVar6 = C;
      iVar8 = R;
      damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col,R,C);
      RVar1 = resizeflag;
      if (TVar5 == CONTEXT_CELL) {
        this->select_row = iVar8;
        this->current_row = iVar8;
        this->select_col = iVar6;
        this->current_col = iVar6;
        this->_selecting = 0x10;
      }
      else if (resizeflag == RESIZE_NONE) {
        this->current_row = -1;
        this->current_col = -1;
        this->select_row = -1;
        this->select_col = -1;
      }
    }
    if (RVar1 == RESIZE_NONE &&
        (this->super_Fl_Group).super_Fl_Widget.callback_ != (Fl_Callback *)0x0) {
      this->_callback_context = TVar5;
      this->_callback_row = R;
      this->_callback_col = C;
      Fl_Widget::do_callback((Fl_Widget *)this);
    }
    switch(TVar5 << 0x1e | TVar5 >> 2) {
    case CONTEXT_NONE:
      if ((iVar3 == 0xfee9) &&
         (local_34 < this->_row_header_w + (this->super_Fl_Group).super_Fl_Widget.x_)) {
        C = this->_cols + -1;
        this->select_col = C;
        this->current_row = 0;
        this->current_col = 0;
        iVar8 = this->_rows + -1;
        this->select_row = iVar8;
        iVar4 = 0;
LAB_001c925a:
        iVar6 = 0;
LAB_001c92ba:
        damage_zone(this,iVar4,iVar6,iVar8,C,0,0);
        goto switchD_001c8eb3_caseD_4;
      }
      break;
    case CONTEXT_STARTPAGE:
      if (iVar3 == 0xfee9) {
        if (RVar1 == RESIZE_NONE) {
          if (((Fl_Table *)Fl::focus_ != this) &&
             (iVar8 = Fl_Widget::contains((Fl_Widget *)this,Fl::focus_), iVar8 != 0)) {
            return 0;
          }
          this->select_row = R;
          this->current_row = R;
          this->current_col = 0;
          C = this->_cols + -1;
          this->select_col = C;
          this->_selecting = 4;
          iVar8 = R;
          iVar4 = R;
          goto LAB_001c925a;
        }
        this->_resizing_row = R + -1 + (uint)((RVar1 & RESIZE_ROW_ABOVE) == RESIZE_NONE);
        this->_resizing_col = -1;
        this->_dragging_y = local_38;
        goto switchD_001c8eb3_caseD_4;
      }
      break;
    case CONTEXT_ENDPAGE:
      if (iVar3 == 0xfee9) {
        if (RVar1 == RESIZE_NONE) {
          if (((Fl_Table *)Fl::focus_ != this) &&
             (iVar8 = Fl_Widget::contains((Fl_Widget *)this,Fl::focus_), iVar8 != 0)) {
            return 0;
          }
          this->select_col = C;
          this->current_col = C;
          this->current_row = 0;
          iVar8 = this->_rows + -1;
          this->select_row = iVar8;
          this->_selecting = 8;
          iVar4 = 0;
          iVar6 = C;
          goto LAB_001c92ba;
        }
        this->_resizing_col = C - (RVar1 & RESIZE_COL_LEFT);
        this->_resizing_row = -1;
        this->_dragging_x = local_34;
        goto switchD_001c8eb3_caseD_4;
      }
      break;
    default:
      iVar4 = 0;
      break;
    case CONTEXT_ROW_HEADER:
switchD_001c8eb3_caseD_4:
      iVar4 = 1;
    }
    this->_last_row = R;
    break;
  case 2:
    _stop_auto_drag(this);
    uVar2 = TVar5 - CONTEXT_ROW_HEADER >> 2;
    if ((((TVar5 << 0x1e | uVar2) < 8) && ((0x8bU >> (uVar2 & 0x1f) & 1) != 0)) &&
       (((this->_resizing_col == -1 &&
         (((this->_resizing_row == -1 &&
           ((this->super_Fl_Group).super_Fl_Widget.callback_ != (Fl_Callback *)0x0)) &&
          (((this->super_Fl_Group).super_Fl_Widget.when_ & 4) != 0)))) && (this->_last_row == R))))
    {
      this->_callback_context = TVar5;
      this->_callback_row = this->_last_row;
      this->_callback_col = C;
      Fl_Widget::do_callback((Fl_Widget *)this);
    }
    if (iVar3 == 0xfee9) {
      change_cursor(this,FL_CURSOR_DEFAULT);
      this->_resizing_col = -1;
      this->_resizing_row = -1;
      iVar4 = 1;
    }
    break;
  case 3:
    iVar6 = 1;
    if (iVar4 == 0) {
      Fl_Widget::take_focus((Fl_Widget *)this);
    }
    goto LAB_001c8d37;
  case 4:
    iVar6 = iVar4;
LAB_001c8d37:
    iVar8 = 1;
    if (resizeflag == RESIZE_NONE) {
      iVar8 = iVar6;
    }
    iVar4 = iVar8;
    if (event == 4) {
      _stop_auto_drag(this);
LAB_001c8d56:
      FVar9 = FL_CURSOR_DEFAULT;
LAB_001c8e1c:
      change_cursor(this,FVar9);
      iVar4 = iVar8;
    }
    break;
  case 5:
    if (this->_auto_drag == 1) {
      return 1;
    }
    iVar8 = this->_resizing_col;
    if ((long)iVar8 < 0) {
      iVar8 = this->_resizing_row;
      if (-1 < (long)iVar8) {
        iVar4 = 0;
        if (iVar8 < (int)(this->_rowheights)._size) {
          iVar4 = (this->_rowheights).arr[iVar8];
        }
        iVar4 = (Fl::e_y - this->_dragging_y) + iVar4;
        if (iVar4 <= this->_row_resize_min) {
          iVar4 = this->_row_resize_min;
        }
        row_height(this,iVar8,iVar4);
        this->_dragging_y = iVar7;
        table_resized(this);
        Fl_Widget::redraw((Fl_Widget *)this);
        FVar9 = FL_CURSOR_NS;
        goto LAB_001c8fd7;
      }
      if (Fl::e_keysym == 0xfee9) {
        iVar8 = this->_selecting;
        if (TVar5 == CONTEXT_CELL && iVar8 == 0x10) {
          if (Fl::e_clicks != 0) {
            return iVar4;
          }
          iVar8 = this->select_col;
          if (iVar8 != C || this->select_row != R) {
            damage_zone(this,this->current_row,this->current_col,this->select_row,iVar8,R,C);
            iVar8 = C;
          }
          this->select_row = R;
          this->select_col = iVar8;
        }
        else if ((TVar5 & (CONTEXT_CELL|CONTEXT_COL_HEADER|CONTEXT_ROW_HEADER)) == CONTEXT_NONE ||
                 iVar8 != 4) {
          if (iVar8 != 8 ||
              (TVar5 & (CONTEXT_CELL|CONTEXT_COL_HEADER|CONTEXT_ROW_HEADER)) == CONTEXT_NONE)
          goto LAB_001c9019;
          if (this->select_col != C) {
            damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col,R
                        ,C);
          }
          this->select_col = C;
        }
        else {
          if (this->select_row != R) {
            damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col,R
                        ,C);
          }
          this->select_row = R;
        }
        iVar4 = 1;
      }
    }
    else {
      iVar4 = 0;
      if (iVar8 < (int)(this->_colwidths)._size) {
        iVar4 = (this->_colwidths).arr[iVar8];
      }
      iVar4 = (Fl::e_x - this->_dragging_x) + iVar4;
      if (iVar4 <= this->_col_resize_min) {
        iVar4 = this->_col_resize_min;
      }
      col_width(this,iVar8,iVar4);
      this->_dragging_x = iVar6;
      table_resized(this);
      Fl_Widget::redraw((Fl_Widget *)this);
      FVar9 = FL_CURSOR_WE;
LAB_001c8fd7:
      change_cursor(this,FVar9);
      iVar4 = 1;
      if (((this->super_Fl_Group).super_Fl_Widget.callback_ != (Fl_Callback *)0x0) &&
         (((this->super_Fl_Group).super_Fl_Widget.when_ & 1) != 0)) {
        this->_callback_context = CONTEXT_RC_RESIZE;
        this->_callback_row = R;
        this->_callback_col = C;
        Fl_Widget::do_callback((Fl_Widget *)this);
      }
    }
LAB_001c9019:
    if ((((this->_resizing_row < 0) && (this->_resizing_col < 0)) && (this->_auto_drag == 0)) &&
       (((iVar8 = (this->super_Fl_Group).super_Fl_Widget.x_,
         (this->super_Fl_Group).super_Fl_Widget.w_ + iVar8 + -0x14 < iVar6 ||
         (iVar6 < iVar8 + this->_row_header_w)) ||
        ((iVar8 = (this->super_Fl_Group).super_Fl_Widget.y_,
         (this->super_Fl_Group).super_Fl_Widget.h_ + iVar8 + -0x14 < iVar7 ||
         (iVar7 < iVar8 + this->_col_header_h)))))) {
      _start_auto_drag(this);
    }
    break;
  case 6:
    Fl::focus((Fl_Widget *)this);
  case 7:
    _stop_auto_drag(this);
    iVar4 = iVar8;
    break;
  case 8:
    iVar8 = this->select_row;
    iVar4 = this->select_col;
    switch(Fl::e_keysym) {
    case 0xff50:
      iVar6 = 0;
      iVar7 = -1000000;
      goto LAB_001c90cb;
    case 0xff51:
      iVar7 = -1;
      goto LAB_001c90a0;
    case 0xff52:
      iVar6 = -1;
      break;
    case 0xff53:
      iVar7 = 1;
LAB_001c90a0:
      iVar6 = 0;
      goto LAB_001c90cb;
    case 0xff54:
      iVar6 = 1;
      break;
    case 0xff55:
      iVar6 = (this->toprow - this->botrow) + 1;
      break;
    case 0xff56:
      iVar6 = ~this->toprow + this->botrow;
      break;
    case 0xff57:
      iVar6 = 0;
      iVar7 = 1000000;
      goto LAB_001c90cb;
    default:
      iVar6 = iVar8;
      if ((this->super_Fl_Group).super_Fl_Widget.callback_ == (Fl_Callback *)0x0) {
        return 0;
      }
      goto LAB_001c9135;
    }
    iVar7 = 0;
LAB_001c90cb:
    iVar7 = move_cursor(this,iVar6,iVar7);
    if ((iVar7 != 0) && ((Fl_Table *)Fl::focus_ != this)) {
      this->_callback_context = CONTEXT_TABLE;
      this->_callback_row = -1;
      this->_callback_col = -1;
      Fl_Widget::do_callback((Fl_Widget *)this);
      Fl_Widget::take_focus((Fl_Widget *)this);
    }
    if ((this->super_Fl_Group).super_Fl_Widget.callback_ == (Fl_Callback *)0x0) {
      return iVar7;
    }
    iVar6 = this->select_row;
    if (iVar7 == 0) {
LAB_001c9135:
      iVar7 = 0;
      if (((this->super_Fl_Group).super_Fl_Widget.when_ & 2) == 0 && iVar8 == iVar6)
      goto LAB_001c9148;
    }
    else if (iVar8 == iVar6) {
      iVar7 = 1;
LAB_001c9148:
      iVar6 = iVar8;
      if (iVar4 == this->select_col) {
        return iVar7;
      }
    }
    this->_callback_context = CONTEXT_CELL;
    this->_callback_row = iVar6;
    this->_callback_col = this->select_col;
    Fl_Widget::do_callback((Fl_Widget *)this);
    iVar4 = 1;
    break;
  default:
    change_cursor(this,FL_CURSOR_DEFAULT);
    break;
  case 0xb:
    if (resizeflag == RESIZE_NONE || TVar5 != CONTEXT_COL_HEADER) {
      if (TVar5 == CONTEXT_ROW_HEADER && resizeflag != RESIZE_NONE) {
        FVar9 = FL_CURSOR_NS;
        goto LAB_001c8e1c;
      }
      goto LAB_001c8d56;
    }
    FVar9 = FL_CURSOR_WE;
    goto LAB_001c8e1c;
  }
  return iVar4;
}

Assistant:

int Fl_Table::handle(int event) {
  PRINTEVENT;
  int ret = Fl_Group::handle(event);	// let FLTK group handle events first
  // Which row/column are we over?
  int R, C;  				// row/column being worked on
  ResizeFlag resizeflag;		// which resizing area are we over? (0=none)
  TableContext context = cursor2rowcol(R, C, resizeflag);
  if (ret) {
    if (Fl::event_inside(hscrollbar) || Fl::event_inside(vscrollbar)) return 1;
    if ( context != CONTEXT_ROW_HEADER &&		// mouse not in row header (STR#2742)
         context != CONTEXT_COL_HEADER &&		// mouse not in col header (STR#2742)
         Fl::focus() != this && 			// we don't have focus?
         contains(Fl::focus())) {			// focus is a child?
      return 1;
    }
  }
  // Make snapshots of realtime event states *before* we service user's cb,
  // which may do things like post popup menus that return with unexpected button states.
  int _event_button = Fl::event_button();
  int _event_clicks = Fl::event_clicks();
  int _event_x      = Fl::event_x();
  int _event_y      = Fl::event_y();
  int _event_key    = Fl::event_key();
#if FLTK_ABI_VERSION >= 10303
  int _event_state  = Fl::event_state();
#endif
  Fl_Widget *_focus = Fl::focus();
  switch ( event ) {
    case FL_PUSH:
      // Single left-click on table? do user's callback with CONTEXT_TABLE
      if (_event_button == 1 && !_event_clicks) {
        if (_focus == this) {
          take_focus();
          do_callback(CONTEXT_TABLE, -1, -1);
          ret = 1;
        }
        damage_zone(current_row, current_col, select_row, select_col, R, C);
        if (context == CONTEXT_CELL) {
          current_row = select_row = R;
          current_col = select_col = C;
          _selecting = CONTEXT_CELL;
        } else {
	  // Clear selection if not resizing row/col
	  if ( !resizeflag ) {
            current_row = select_row = -1;
            current_col = select_col = -1;
	  }
        }
      }
      // A click on table with user's callback defined?
      //     Need this for eg. right click to pop up a menu
      //
      if ( Fl_Widget::callback() &&		// callback defined?
          resizeflag == RESIZE_NONE ) {		// not resizing?
        do_callback(context, R, C);		// do callback with context (cell, header, etc)
      }
      // Handle selection if handling a left-click
      //    Use snapshot of _event_button we made before servicing user's cb's
      //    to avoid checking realtime state of buttons which may have changed
      //    during the user's callbacks.
      //
      switch ( context ) {
        case CONTEXT_CELL:
          // FL_PUSH on a cell?
          ret = 1;				// express interest in FL_RELEASE
          break;
          
        case CONTEXT_NONE:
          // FL_PUSH on table corner?
          if ( _event_button == 1 && _event_x < x() + row_header_width()) {
            current_col = 0;
            select_col = cols() - 1;
            current_row = 0;
            select_row = rows() - 1;				
            damage_zone(current_row, current_col, select_row, select_col);
            ret = 1;
          }
          break;
          
        case CONTEXT_COL_HEADER:
          // FL_PUSH on a column header?
          if ( _event_button == 1) {
            // Resizing? Handle it
            if ( resizeflag ) {
              // Start resize if left click on column border.
              //    "ret=1" ensures we get drag events from now on.
              //    (C-1) is used if mouse is over the left hand side 
              //    of cell, so we resize the next column on the left.
              //
              _resizing_col = ( resizeflag & RESIZE_COL_LEFT ) ? C-1 : C; 
              _resizing_row = -1;
              _dragging_x = _event_x;
              ret = 1;
            } else {
              // Not resizing? Select the column
	      if ( Fl::focus() != this && contains(Fl::focus()) ) return 0;	// STR #3018 - item 1
              current_col = select_col = C;
              current_row = 0;
              select_row = rows() - 1;
              _selecting = CONTEXT_COL_HEADER;
              damage_zone(current_row, current_col, select_row, select_col);
              ret = 1;
            }
          }
          break;
          
        case CONTEXT_ROW_HEADER:
          // FL_PUSH on a row header?
          if ( _event_button == 1 ) {
            // Resizing? Handle it
            if ( resizeflag ) {
              // Start resize if left mouse clicked on row border.
              //    "ret = 1" ensures we get drag events from now on.
              //    (R-1) is used if mouse is over the top of the cell,
              //    so that we resize the row above.
              //
              _resizing_row = ( resizeflag & RESIZE_ROW_ABOVE ) ? R-1 : R; 
              _resizing_col = -1;
              _dragging_y = _event_y; 
              ret = 1;
            } else {
              // Not resizing? Select the row
	      if ( Fl::focus() != this && contains(Fl::focus()) ) return 0;	// STR #3018 - item 1
              current_row = select_row = R;
              current_col = 0;
              select_col = cols() - 1;
              _selecting = CONTEXT_ROW_HEADER;
              damage_zone(current_row, current_col, select_row, select_col);
              ret = 1;
            }
          }
          break;
          
        default:
          ret = 0;		// express disinterest
          break;
      }
      _last_row = R;
      break;
      
    case FL_DRAG:
      if (_auto_drag == 1) {
        ret = 1;
        break;
      } 
      if ( _resizing_col > -1 ) {
        // Dragging column?
        //
        //    Let user drag even /outside/ the row/col widget.
        //    Don't allow column width smaller than 1.
        //    Continue to show FL_CURSOR_WE at all times during drag.
        //
        int offset = _dragging_x - _event_x;
        int new_w = col_width(_resizing_col) - offset;
        if ( new_w < _col_resize_min ) new_w = _col_resize_min;
        col_width(_resizing_col, new_w);
        _dragging_x = _event_x;
        table_resized();
        redraw();
        change_cursor(FL_CURSOR_WE);
        ret = 1;
        if ( Fl_Widget::callback() && when() & FL_WHEN_CHANGED ) {
          do_callback(CONTEXT_RC_RESIZE, R, C);
        }
      }
      else if ( _resizing_row > -1 ) {
        // Dragging row?
        //
        //    Let user drag even /outside/ the row/col widget.
        //    Don't allow row width smaller than 1.
        //    Continue to show FL_CURSOR_NS at all times during drag.
        //
        int offset = _dragging_y - _event_y;
        int new_h = row_height(_resizing_row) - offset;
        if ( new_h < _row_resize_min ) new_h = _row_resize_min;
        row_height(_resizing_row, new_h);
        _dragging_y = _event_y;
        table_resized();
        redraw();
        change_cursor(FL_CURSOR_NS);
        ret = 1;
        if ( Fl_Widget::callback() && when() & FL_WHEN_CHANGED ) {
          do_callback(CONTEXT_RC_RESIZE, R, C);
        }
      } else {
        if (_event_button == 1 && 
            _selecting == CONTEXT_CELL &&
            context == CONTEXT_CELL) {
          // Dragging a cell selection?
	  if ( _event_clicks ) break;			// STR #3018 - item 2
          if (select_row != R || select_col != C) {
            damage_zone(current_row, current_col, select_row, select_col, R, C);
          }
          select_row = R;
          select_col = C;
          ret = 1;
        }
        else if (_event_button == 1 && 
                 _selecting == CONTEXT_ROW_HEADER && 
                 context & (CONTEXT_ROW_HEADER|CONTEXT_COL_HEADER|CONTEXT_CELL)) {
          if (select_row != R) {
            damage_zone(current_row, current_col, select_row, select_col, R, C);
          }
          select_row = R;
          ret = 1;
        }
        else if (_event_button == 1 && 
                 _selecting == CONTEXT_COL_HEADER 
                 && context & (CONTEXT_ROW_HEADER|CONTEXT_COL_HEADER|CONTEXT_CELL)) {
          if (select_col != C) {
            damage_zone(current_row, current_col, select_row, select_col, R, C);
          }
          select_col = C;
          ret = 1;
        }
      }
      // Enable autodrag if not resizing, and mouse has moved off table edge
      if ( _resizing_row < 0 && _resizing_col < 0 && _auto_drag == 0 && 
          ( _event_x > x() + w() - 20 ||
            _event_x < x() + row_header_width() || 
            _event_y > y() + h() - 20 ||
            _event_y < y() + col_header_height()
           ) ) {
            _start_auto_drag();
          }
      break;
      
    case FL_RELEASE:
      _stop_auto_drag();
      switch ( context ) {
        case CONTEXT_ROW_HEADER:		// release on row header
        case CONTEXT_COL_HEADER:		// release on col header
        case CONTEXT_CELL:			// release on a cell
        case CONTEXT_TABLE:			// release on dead zone
          if ( _resizing_col == -1 &&		// not resizing a column
              _resizing_row == -1 &&		// not resizing a row
              Fl_Widget::callback() && 		// callback defined
              when() & FL_WHEN_RELEASE && 	// on button release
              _last_row == R ) {		// release on same row PUSHed?
            // Need this for eg. left clicking on a cell to select it
            do_callback(context, R, C);
          }
          break;
          
        default:
          break;
      }
      if ( _event_button == 1 ) {
        change_cursor(FL_CURSOR_DEFAULT);
        _resizing_col = -1;
        _resizing_row = -1;
        ret = 1;
      }
      break;
      
    case FL_MOVE:
      if ( context == CONTEXT_COL_HEADER && 		// in column header?
          resizeflag ) {				// resize + near boundary?
        change_cursor(FL_CURSOR_WE);			// show resize cursor
      }
      else if ( context == CONTEXT_ROW_HEADER && 	// in row header?
               resizeflag ) {				// resize + near boundary?
        change_cursor(FL_CURSOR_NS);			// show resize cursor
      } else {
        change_cursor(FL_CURSOR_DEFAULT);		// normal cursor
      }
      ret = 1;
      break;
      
    case FL_ENTER:		// See FLTK event docs on the FL_ENTER widget
      if (!ret) take_focus();
      ret = 1;
      //FALLTHROUGH
      
    case FL_LEAVE:		// We want to track the mouse if resizing is allowed.
      if ( resizeflag ) {
        ret = 1;
      }
      if ( event == FL_LEAVE ) {
        _stop_auto_drag();
        change_cursor(FL_CURSOR_DEFAULT);
      }
      break;
      
    case FL_FOCUS:
      Fl::focus(this);
      //FALLTHROUGH
      
    case FL_UNFOCUS:
      _stop_auto_drag();
      ret = 1;
      break;
      
    case FL_KEYBOARD: {
      ret = 0;
      int is_row = select_row;
      int is_col = select_col;
      switch(_event_key) {
        case FL_Home:
          ret = move_cursor(0, -1000000);
          break;
        case FL_End:
          ret = move_cursor(0, 1000000);
          break;
        case FL_Page_Up:
          ret = move_cursor(-(botrow - toprow - 1), 0);
          break;
        case FL_Page_Down:
          ret = move_cursor(botrow - toprow - 1 , 0);
          break;
        case FL_Left:
          ret = move_cursor(0, -1);
          break;
        case FL_Right:
          ret = move_cursor(0, 1);
          break;
        case FL_Up:
          ret = move_cursor(-1, 0);
          break;
        case FL_Down:
          ret = move_cursor(1, 0);
          break;
	case FL_Tab:
#if FLTK_ABI_VERSION >= 10303
	  if ( !tab_cell_nav() ) break;		// not navigating cells? let fltk handle it (STR#2862)
	  if ( _event_state & FL_SHIFT ) {
            ret = move_cursor(0, -1, 0);	// shift-tab -> left
	  } else {
	    ret = move_cursor(0, 1, 0);		// tab -> right
	  }
          break;
#else
          break;				// without tab_cell_nav(), Fl_Table should default to navigating widgets, not cells
#endif
      }
      if (ret && Fl::focus() != this) {
        do_callback(CONTEXT_TABLE, -1, -1);
        take_focus();
      }
      //if (!ret && Fl_Widget::callback() && when() & FL_WHEN_NOT_CHANGED  )
      if ( Fl_Widget::callback() && 
          (
           ( !ret && when() & FL_WHEN_NOT_CHANGED ) || 
           ( is_row!= select_row || is_col!= select_col ) 
           )
          ) {
        do_callback(CONTEXT_CELL, select_row, select_col); 
        //damage_zone(current_row, current_col, select_row, select_col);
        ret = 1;
      }
      break;
    }
      
    default:
      change_cursor(FL_CURSOR_DEFAULT);
      break;
  }
  return(ret);
}